

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.hpp
# Opt level: O2

void __thiscall pstore::http::request_info::~request_info(request_info *this)

{
  std::__cxx11::string::~string((string *)&this->version_);
  std::__cxx11::string::~string((string *)&this->uri_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~request_info () noexcept = default;